

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_massage_var(vector_t ***var,float32 fudge_factor,uint32 n_mgau,uint32 n_stream,
                      uint32 n_density,uint32 *veclen)

{
  uint local_38;
  uint local_34;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_stream_local;
  uint32 n_mgau_local;
  float32 fudge_factor_local;
  vector_t ***var_local;
  
  for (l = 0; l < n_stream; l = l + 1) {
    for (local_38 = 0; local_38 < veclen[l]; local_38 = local_38 + 1) {
      for (k = 0; k < n_mgau; k = k + 1) {
        for (local_34 = 0; local_34 < n_density; local_34 = local_34 + 1) {
          var[k][l][local_34][local_38] = (float)fudge_factor * var[k][l][local_34][local_38];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_massage_var(vector_t ***var,
		  float32 fudge_factor,
		  uint32 n_mgau,
		  uint32 n_stream,
		  uint32 n_density,
		  const uint32 *veclen)
{
    uint32 i, j, k, l;
    
    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    var[i][j][k][l] *= fudge_factor;
		}
	    }
	}
    }

    return S3_SUCCESS;
}